

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# COBLoader.cpp
# Opt level: O0

void __thiscall
Assimp::COBImporter::ReadBasicNodeInfo_Binary
          (COBImporter *this,Node *msh,StreamReaderLE *reader,ChunkInfo *param_3)

{
  int16_t iVar1;
  basic_formatter<char,std::char_traits<char>,std::allocator<char>> *this_00;
  basic_formatter *this_01;
  float *pfVar2;
  float fVar3;
  uint local_224;
  uint local_220;
  uint x;
  uint y;
  char local_1c9;
  basic_formatter<char,_std::char_traits<char>,_std::allocator<char>_> local_1c8;
  string local_50;
  uint local_2c;
  ChunkInfo *pCStack_28;
  uint dupes;
  ChunkInfo *param_3_local;
  StreamReaderLE *reader_local;
  Node *msh_local;
  COBImporter *this_local;
  
  pCStack_28 = param_3;
  param_3_local = (ChunkInfo *)reader;
  reader_local = (StreamReaderLE *)msh;
  msh_local = (Node *)this;
  iVar1 = StreamReader<false,_false>::GetI2(reader);
  local_2c = (uint)iVar1;
  ReadString_Binary(this,(string *)(reader_local + 2),(StreamReaderLE *)param_3_local);
  Formatter::basic_formatter<char,std::char_traits<char>,std::allocator<char>>::
  basic_formatter<std::__cxx11::string>
            ((basic_formatter<char,std::char_traits<char>,std::allocator<char>> *)&local_1c8,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)(reader_local + 2)
            );
  local_1c9 = '_';
  this_00 = (basic_formatter<char,std::char_traits<char>,std::allocator<char>> *)
            Formatter::basic_formatter<char,std::char_traits<char>,std::allocator<char>>::operator<<
                      ((basic_formatter<char,std::char_traits<char>,std::allocator<char>> *)
                       &local_1c8,&local_1c9);
  this_01 = (basic_formatter *)
            Formatter::basic_formatter<char,std::char_traits<char>,std::allocator<char>>::operator<<
                      (this_00,&local_2c);
  Formatter::basic_formatter::operator_cast_to_string(&local_50,this_01);
  std::__cxx11::string::operator=((string *)(reader_local + 2),(string *)&local_50);
  std::__cxx11::string::~string((string *)&local_50);
  Formatter::basic_formatter<char,_std::char_traits<char>,_std::allocator<char>_>::~basic_formatter
            (&local_1c8);
  StreamReader<false,_false>::IncPtr((StreamReader<false,_false> *)param_3_local,0x30);
  aiMatrix4x4t<float>::aiMatrix4x4t((aiMatrix4x4t<float> *)&x);
  memcpy(&reader_local[2].end,&x,0x40);
  for (local_220 = 0; local_220 < 3; local_220 = local_220 + 1) {
    for (local_224 = 0; local_224 < 4; local_224 = local_224 + 1) {
      fVar3 = StreamReader<false,_false>::GetF4((StreamReader<false,_false> *)param_3_local);
      pfVar2 = aiMatrix4x4t<float>::operator[]
                         ((aiMatrix4x4t<float> *)&reader_local[2].end,local_220);
      pfVar2[local_224] = fVar3;
    }
  }
  return;
}

Assistant:

void COBImporter::ReadBasicNodeInfo_Binary(Node& msh, StreamReaderLE& reader, const ChunkInfo& /*nfo*/)
{
    const unsigned int dupes = reader.GetI2();
    ReadString_Binary(msh.name,reader);

    msh.name = format(msh.name)<<'_'<<dupes;

    // skip local axes for the moment
    reader.IncPtr(48);

    msh.transform = aiMatrix4x4();
    for(unsigned int y = 0; y < 3; ++y) {
        for(unsigned int x =0; x < 4; ++x) {
            msh.transform[y][x] = reader.GetF4();
        }
    }
}